

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_any.hpp
# Opt level: O2

string * __thiscall
iutest::any::
holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::to_string
          (string *__return_storage_ptr__,
          holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  
  PrintToString<std::__cxx11::string>(__return_storage_ptr__,(iutest *)&this->held,in_RDX);
  return __return_storage_ptr__;
}

Assistant:

virtual ::std::string to_string() const IUTEST_CXX_OVERRIDE
        {
            return PrintToString(held);
        }